

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap.c
# Opt level: O0

int pcap_datalink_name_to_val(char *name)

{
  int iVar1;
  int local_1c;
  int i;
  char *name_local;
  
  local_1c = 0;
  while( true ) {
    if (dlt_choices[local_1c].name == (char *)0x0) {
      return -1;
    }
    iVar1 = pcap_strcasecmp(dlt_choices[local_1c].name + 4,name);
    if (iVar1 == 0) break;
    local_1c = local_1c + 1;
  }
  return dlt_choices[local_1c].dlt;
}

Assistant:

int
pcap_datalink_name_to_val(const char *name)
{
	int i;

	for (i = 0; dlt_choices[i].name != NULL; i++) {
		if (pcap_strcasecmp(dlt_choices[i].name + sizeof("DLT_") - 1,
		    name) == 0)
			return (dlt_choices[i].dlt);
	}
	return (-1);
}